

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

void __thiscall
helics::LogManager::addLoggingCLI(LogManager *this,shared_ptr<helics::helicsCLI11App> *app)

{
  element_type *this_00;
  App *pAVar1;
  Option *pOVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *pvVar3;
  string_view fmt;
  format_args args;
  _Any_data local_828;
  _Manager_type local_818;
  code *pcStack_810;
  long *local_800;
  long local_7f8;
  long local_7f0 [2];
  _Any_data local_7e0;
  _Manager_type local_7d0;
  undefined8 uStack_7c8;
  _Any_data local_7c0;
  code *local_7b0;
  undefined8 uStack_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7a0;
  undefined8 local_798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_790;
  undefined4 local_780;
  undefined2 local_77c;
  _Any_data local_778;
  code *local_768;
  undefined8 uStack_760;
  _Any_data local_758;
  code *local_748;
  undefined8 uStack_740;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_738;
  undefined8 local_730;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  undefined4 local_718;
  undefined2 local_714;
  App *local_708;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_700;
  undefined1 *local_6f8 [2];
  undefined1 local_6e8 [16];
  _Any_data local_6d8;
  code *local_6c8;
  code *pcStack_6c0;
  _Any_data local_6b8;
  code *local_6a8;
  code *pcStack_6a0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_690;
  long local_688;
  undefined1 local_680 [16];
  string local_670;
  string local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  string local_610;
  pointer local_5f0;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  _Any_data local_568;
  code *local_558;
  undefined8 local_550;
  _Any_data local_548;
  code *local_538;
  undefined8 local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_528;
  undefined8 local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  undefined4 local_508;
  undefined2 local_504;
  _Any_data local_4f8;
  code *local_4e8;
  undefined8 local_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  undefined8 local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4b8;
  undefined8 local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  undefined4 local_498;
  undefined2 local_494;
  _Any_data local_488;
  _Manager_type local_478;
  undefined8 local_470;
  _Any_data local_468;
  code *local_458;
  undefined8 local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_448;
  undefined8 local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  undefined4 local_428;
  undefined2 local_424;
  _Any_data local_418;
  code *local_408;
  undefined8 local_400;
  _Any_data local_3f8;
  code *local_3e8;
  undefined8 local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  undefined8 local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  undefined4 local_3b8;
  undefined2 local_3b4;
  _Any_data local_3a8;
  _Manager_type local_398;
  undefined8 local_390;
  _Any_data local_388;
  code *local_378;
  undefined8 local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  undefined8 local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  undefined4 local_348;
  undefined2 local_344;
  _Any_data local_338;
  _Manager_type local_328;
  undefined8 local_320;
  _Any_data local_318;
  code *local_308;
  undefined8 local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  undefined8 local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined4 local_2d8;
  undefined2 local_2d4;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  filter_fn_t local_208;
  filter_fn_t local_1e8;
  filter_fn_t local_1c8;
  filter_fn_t local_1a8;
  filter_fn_t local_188;
  filter_fn_t local_168;
  filter_fn_t local_148;
  filter_fn_t local_128;
  filter_fn_t local_108;
  filter_fn_t local_e8;
  filter_fn_t local_c8;
  filter_fn_t local_a8;
  string local_80;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this_00 = (app->super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"logging","");
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_588,"Options related to file and message logging","");
  pAVar1 = &CLI::App::add_option_group<CLI::Option_group>(&this_00->super_App,&local_228,&local_588)
            ->super_App;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"--force_logging_flush","");
  local_6b8._8_8_ = 0;
  pcStack_6a0 = CLI::std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:161:9)>
                ::_M_invoke;
  local_6a8 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:161:9)>
              ::_M_manager;
  local_6b8._M_unused._M_object = this;
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5a8,"flush the log after every message","");
  CLI::App::add_flag_function(pAVar1,&local_248,(function<void_(long)> *)&local_6b8,&local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if (local_6a8 != (code *)0x0) {
    (*local_6a8)((_Any_data *)&local_6b8,(_Any_data *)&local_6b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"--logfile","");
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5c8,"the file to log the messages to","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar1,&local_268,&this->logFile,&local_5c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"--loglevel","");
  local_828._8_8_ = 0;
  pcStack_810 = CLI::std::
                _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:171:13)>
                ::_M_invoke;
  local_818 = CLI::std::
              _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:171:13)>
              ::_M_manager;
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  local_828._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_610,
             "the level at which to log, the higher this is set the more gets logged; set to \"no_print\" for no logging"
             ,"");
  local_708 = pAVar1;
  pOVar2 = CLI::App::add_option_function<int>
                     (pAVar1,&local_288,(function<void_(const_int_&)> *)&local_828,&local_610);
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"HELICS_BROKER_LOG_LEVEL","")
  ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_630);
  local_700 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_a8.super__Function_base._M_functor._8_8_ = 0;
  local_a8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_a8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_a8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_c8.super__Function_base._M_functor._8_8_ = 0;
  local_c8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_c8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_c8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)&local_778,&local_700,&local_a8,&local_c8);
  local_4f8._M_unused._M_object = (void *)0x0;
  local_4f8._8_8_ = 0;
  local_4e8 = (code *)0x0;
  local_4e0 = uStack_760;
  if (local_768 != (code *)0x0) {
    local_4f8._M_unused._M_object = local_778._M_unused._M_object;
    local_4f8._8_8_ = local_778._8_8_;
    local_4e8 = local_768;
    local_768 = (code *)0x0;
    uStack_760 = 0;
  }
  local_4d8._M_unused._M_object = (void *)0x0;
  local_4d8._8_8_ = 0;
  local_4c8 = (code *)0x0;
  local_4c0 = uStack_740;
  if (local_748 != (code *)0x0) {
    local_4d8._M_unused._M_object = local_758._M_unused._M_object;
    local_4d8._8_8_ = local_758._8_8_;
    local_4c8 = local_748;
    local_748 = (code *)0x0;
    uStack_740 = 0;
  }
  local_4b8 = &local_4a8;
  if (local_738 == &local_728) {
    local_4a8._8_4_ = local_728._8_4_;
    local_4a8._12_4_ = local_728._12_4_;
  }
  else {
    local_4b8 = local_738;
  }
  local_4a8._M_allocated_capacity._4_4_ = local_728._M_allocated_capacity._4_4_;
  local_4a8._M_allocated_capacity._0_4_ = local_728._M_allocated_capacity._0_4_;
  local_4b0 = local_730;
  local_730 = 0;
  local_728._M_allocated_capacity._0_4_ = local_728._M_allocated_capacity._0_4_ & 0xffffff00;
  local_498 = local_718;
  local_494 = local_714;
  local_800 = local_7f0;
  local_738 = &local_728;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"");
  pvVar3 = &pOVar2->validators_;
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pOVar2->validators_).
                    super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
                    super__Vector_impl_data._M_start,(value_type *)&local_4f8);
  if (local_7f8 != 0) {
    local_7e0._M_unused._M_object = &local_7d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7e0,local_800,local_7f8 + (long)local_800);
    addLoggingCLI();
  }
  local_60 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)gLogLevelMap_abi_cxx11_;
  local_e8.super__Function_base._M_functor._8_8_ = 0;
  local_e8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_e8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_e8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_108.super__Function_base._M_functor._8_8_ = 0;
  local_108.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_108._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_108.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_7e0,&local_60,&local_e8,&local_108);
  local_338._M_unused._M_object = (_Manager_type *)0x0;
  local_338._8_8_ = 0;
  local_328 = (_Manager_type)0x0;
  local_320 = uStack_7c8;
  if (local_7d0 != (_Manager_type)0x0) {
    local_338._M_unused._M_object = local_7e0._M_unused._M_object;
    local_338._8_8_ = local_7e0._8_8_;
    local_328 = local_7d0;
    local_7d0 = (_Manager_type)0x0;
    uStack_7c8 = 0;
  }
  local_318._M_unused._M_object = (void *)0x0;
  local_318._8_8_ = 0;
  local_308 = (code *)0x0;
  local_300 = uStack_7a8;
  if (local_7b0 != (code *)0x0) {
    local_318._M_unused._M_object = local_7c0._M_unused._M_object;
    local_318._8_8_ = local_7c0._8_8_;
    local_308 = local_7b0;
    local_7b0 = (code *)0x0;
    uStack_7a8 = 0;
  }
  if (local_7a0 == &local_790) {
    local_2e8._8_4_ = local_790._8_4_;
    local_2e8._12_4_ = local_790._12_4_;
    local_2f8 = &local_2e8;
  }
  else {
    local_2f8 = local_7a0;
  }
  local_2e8._M_allocated_capacity._4_4_ = local_790._M_allocated_capacity._4_4_;
  local_2e8._M_allocated_capacity._0_4_ = local_790._M_allocated_capacity._0_4_;
  local_2f0 = local_798;
  local_798 = 0;
  local_790._M_allocated_capacity._0_4_ = local_790._M_allocated_capacity._0_4_ & 0xffffff00;
  local_2d8 = local_780;
  local_2d4 = local_77c;
  local_7a0 = &local_790;
  local_690 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_680;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pvVar3->super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>).
                    _M_impl.super__Vector_impl_data._M_start,(value_type *)&local_338);
  if (local_688 != 0) {
    local_6f8[0] = local_6e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6f8,local_690,
               (undefined1 *)((long)&(local_690->_M_h)._M_buckets + local_688));
    addLoggingCLI();
  }
  if (local_690 !=
      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       *)local_680) {
    operator_delete(local_690,local_680._0_8_ + 1);
  }
  pAVar1 = local_708;
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  if (local_308 != (code *)0x0) {
    (*local_308)(&local_318,&local_318,__destroy_functor);
  }
  if (local_328 != (_Manager_type)0x0) {
    (*local_328)((_Any_data *)&local_338,(_Any_data *)&local_338,__destroy_functor);
  }
  if (local_7a0 != &local_790) {
    operator_delete(local_7a0,
                    CONCAT44(local_790._M_allocated_capacity._4_4_,
                             local_790._M_allocated_capacity._0_4_) + 1);
  }
  if (local_7b0 != (code *)0x0) {
    (*local_7b0)(&local_7c0,&local_7c0,__destroy_functor);
  }
  if (local_7d0 != (_Manager_type)0x0) {
    (*local_7d0)((_Any_data *)&local_7e0,(_Any_data *)&local_7e0,__destroy_functor);
  }
  if (local_108.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_108.super__Function_base._M_manager)
              ((_Any_data *)&local_108,(_Any_data *)&local_108,__destroy_functor);
  }
  if (local_e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e8.super__Function_base._M_manager)
              ((_Any_data *)&local_e8,(_Any_data *)&local_e8,__destroy_functor);
  }
  if (local_800 != local_7f0) {
    operator_delete(local_800,local_7f0[0] + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,local_4a8._M_allocated_capacity + 1);
  }
  if (local_4c8 != (code *)0x0) {
    (*local_4c8)(&local_4d8,&local_4d8,__destroy_functor);
  }
  if (local_4e8 != (code *)0x0) {
    (*local_4e8)((_Any_data *)&local_4f8,(_Any_data *)&local_4f8,__destroy_functor);
  }
  if (local_738 != &local_728) {
    operator_delete(local_738,
                    CONCAT44(local_728._M_allocated_capacity._4_4_,
                             local_728._M_allocated_capacity._0_4_) + 1);
  }
  if (local_748 != (code *)0x0) {
    (*local_748)(&local_758,&local_758,__destroy_functor);
  }
  if (local_768 != (code *)0x0) {
    (*local_768)((_Any_data *)&local_778,(_Any_data *)&local_778,__destroy_functor);
  }
  if (local_c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c8.super__Function_base._M_manager)
              ((_Any_data *)&local_c8,(_Any_data *)&local_c8,__destroy_functor);
  }
  if (local_a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.super__Function_base._M_manager)
              ((_Any_data *)&local_a8,(_Any_data *)&local_a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if (local_818 != (_Manager_type)0x0) {
    (*local_818)((_Any_data *)&local_828,(_Any_data *)&local_828,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"--fileloglevel","");
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_650,"the level at which messages get sent to the file","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar1,&local_2a8,&this->fileLogLevel,&local_650);
  local_690 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_128.super__Function_base._M_functor._8_8_ = 0;
  local_128.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_128._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_128.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_148.super__Function_base._M_functor._8_8_ = 0;
  local_148.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_148._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_148.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)&local_778,&local_690,&local_128,&local_148);
  local_568._M_unused._M_object = (void *)0x0;
  local_568._8_8_ = 0;
  local_558 = (code *)0x0;
  local_550 = uStack_760;
  if (local_768 != (code *)0x0) {
    local_568._M_unused._M_object = local_778._M_unused._M_object;
    local_568._8_8_ = local_778._8_8_;
    local_558 = local_768;
    local_768 = (code *)0x0;
    uStack_760 = 0;
  }
  local_548._M_unused._M_object = (void *)0x0;
  local_548._8_8_ = 0;
  local_538 = (code *)0x0;
  local_530 = uStack_740;
  if (local_748 != (code *)0x0) {
    local_548._M_unused._M_object = local_758._M_unused._M_object;
    local_548._8_8_ = local_758._8_8_;
    local_538 = local_748;
    local_748 = (code *)0x0;
    uStack_740 = 0;
  }
  local_528 = &local_518;
  if (local_738 == &local_728) {
    local_518._8_4_ = local_728._8_4_;
    local_518._12_4_ = local_728._12_4_;
  }
  else {
    local_528 = local_738;
  }
  local_518._M_allocated_capacity._4_4_ = local_728._M_allocated_capacity._4_4_;
  local_518._M_allocated_capacity._0_4_ = local_728._M_allocated_capacity._0_4_;
  local_520 = local_730;
  local_730 = 0;
  local_728._M_allocated_capacity._0_4_ = local_728._M_allocated_capacity._0_4_ & 0xffffff00;
  local_508 = local_718;
  local_504 = local_714;
  local_828._M_unused._M_object = &local_818;
  local_738 = &local_728;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"");
  pvVar3 = &pOVar2->validators_;
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pOVar2->validators_).
                    super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
                    super__Vector_impl_data._M_start,(value_type *)&local_568);
  if (local_828._8_8_ != 0) {
    local_7e0._M_unused._M_object = &local_7d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7e0,local_828._M_unused._M_object,
               local_828._8_8_ + (long)local_828._M_unused._0_8_);
    addLoggingCLI();
  }
  local_700 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_168.super__Function_base._M_functor._8_8_ = 0;
  local_168.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_168._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_168.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_188.super__Function_base._M_functor._8_8_ = 0;
  local_188.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_188._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_188.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_7e0,&local_700,&local_168,&local_188);
  local_3a8._M_unused._M_object = (_Manager_type *)0x0;
  local_3a8._8_8_ = 0;
  local_398 = (_Manager_type)0x0;
  local_390 = uStack_7c8;
  if (local_7d0 != (_Manager_type)0x0) {
    local_3a8._M_unused._M_object = local_7e0._M_unused._M_object;
    local_3a8._8_8_ = local_7e0._8_8_;
    local_398 = local_7d0;
    local_7d0 = (_Manager_type)0x0;
    uStack_7c8 = 0;
  }
  local_388._M_unused._M_object = (void *)0x0;
  local_388._8_8_ = 0;
  local_378 = (code *)0x0;
  local_370 = uStack_7a8;
  if (local_7b0 != (code *)0x0) {
    local_388._M_unused._M_object = local_7c0._M_unused._M_object;
    local_388._8_8_ = local_7c0._8_8_;
    local_378 = local_7b0;
    local_7b0 = (code *)0x0;
    uStack_7a8 = 0;
  }
  if (local_7a0 == &local_790) {
    local_358._8_4_ = local_790._8_4_;
    local_358._12_4_ = local_790._12_4_;
    local_368 = &local_358;
  }
  else {
    local_368 = local_7a0;
  }
  local_358._M_allocated_capacity._4_4_ = local_790._M_allocated_capacity._4_4_;
  local_358._M_allocated_capacity._0_4_ = local_790._M_allocated_capacity._0_4_;
  local_360 = local_798;
  local_798 = 0;
  local_790._M_allocated_capacity._0_4_ = local_790._M_allocated_capacity._0_4_ & 0xffffff00;
  local_348 = local_780;
  local_344 = local_77c;
  local_800 = local_7f0;
  local_7a0 = &local_790;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pvVar3->super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>).
                    _M_impl.super__Vector_impl_data._M_start,(value_type *)&local_3a8);
  if (local_7f8 != 0) {
    local_6f8[0] = local_6e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6f8,local_800,local_7f8 + (long)local_800);
    addLoggingCLI();
  }
  if (local_800 != local_7f0) {
    operator_delete(local_800,local_7f0[0] + 1);
  }
  pAVar1 = local_708;
  if (local_368 != &local_358) {
    operator_delete(local_368,local_358._M_allocated_capacity + 1);
  }
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,__destroy_functor);
  }
  if (local_398 != (_Manager_type)0x0) {
    (*local_398)((_Any_data *)&local_3a8,(_Any_data *)&local_3a8,__destroy_functor);
  }
  if (local_7a0 != &local_790) {
    operator_delete(local_7a0,
                    CONCAT44(local_790._M_allocated_capacity._4_4_,
                             local_790._M_allocated_capacity._0_4_) + 1);
  }
  if (local_7b0 != (code *)0x0) {
    (*local_7b0)(&local_7c0,&local_7c0,__destroy_functor);
  }
  if (local_7d0 != (_Manager_type)0x0) {
    (*local_7d0)((_Any_data *)&local_7e0,(_Any_data *)&local_7e0,__destroy_functor);
  }
  if (local_188.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_188.super__Function_base._M_manager)
              ((_Any_data *)&local_188,(_Any_data *)&local_188,__destroy_functor);
  }
  if (local_168.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_168.super__Function_base._M_manager)
              ((_Any_data *)&local_168,(_Any_data *)&local_168,__destroy_functor);
  }
  if ((_Manager_type *)local_828._M_unused._0_8_ != &local_818) {
    operator_delete(local_828._M_unused._M_object,(ulong)(local_818 + 1));
  }
  if (local_528 != &local_518) {
    operator_delete(local_528,local_518._M_allocated_capacity + 1);
  }
  if (local_538 != (code *)0x0) {
    (*local_538)(&local_548,&local_548,__destroy_functor);
  }
  if (local_558 != (code *)0x0) {
    (*local_558)((_Any_data *)&local_568,(_Any_data *)&local_568,__destroy_functor);
  }
  if (local_738 != &local_728) {
    operator_delete(local_738,
                    CONCAT44(local_728._M_allocated_capacity._4_4_,
                             local_728._M_allocated_capacity._0_4_) + 1);
  }
  if (local_748 != (code *)0x0) {
    (*local_748)(&local_758,&local_758,__destroy_functor);
  }
  if (local_768 != (code *)0x0) {
    (*local_768)((_Any_data *)&local_778,(_Any_data *)&local_778,__destroy_functor);
  }
  if (local_148.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_148.super__Function_base._M_manager)
              ((_Any_data *)&local_148,(_Any_data *)&local_148,__destroy_functor);
  }
  if (local_128.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_128.super__Function_base._M_manager)
              ((_Any_data *)&local_128,(_Any_data *)&local_128,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"--consoleloglevel","");
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_680 + 0x10),"the level at which messages get sent to the file","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar1,&local_2c8,&this->consoleLogLevel,(string *)(local_680 + 0x10));
  local_690 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_1a8.super__Function_base._M_functor._8_8_ = 0;
  local_1a8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_1a8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_1a8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_1c8.super__Function_base._M_functor._8_8_ = 0;
  local_1c8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_1c8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_1c8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)&local_778,&local_690,&local_1a8,&local_1c8);
  local_418._M_unused._M_object = (void *)0x0;
  local_418._8_8_ = 0;
  local_408 = (code *)0x0;
  local_400 = uStack_760;
  if (local_768 != (code *)0x0) {
    local_418._M_unused._M_object = local_778._M_unused._M_object;
    local_418._8_8_ = local_778._8_8_;
    local_408 = local_768;
    local_768 = (code *)0x0;
    uStack_760 = 0;
  }
  local_3f8._M_unused._M_object = (void *)0x0;
  local_3f8._8_8_ = 0;
  local_3e8 = (code *)0x0;
  local_3e0 = uStack_740;
  if (local_748 != (code *)0x0) {
    local_3f8._M_unused._M_object = local_758._M_unused._M_object;
    local_3f8._8_8_ = local_758._8_8_;
    local_3e8 = local_748;
    local_748 = (code *)0x0;
    uStack_740 = 0;
  }
  if (local_738 == &local_728) {
    local_3c8._8_4_ = local_728._8_4_;
    local_3c8._12_4_ = local_728._12_4_;
    local_3d8 = &local_3c8;
  }
  else {
    local_3d8 = local_738;
  }
  local_3c8._M_allocated_capacity._4_4_ = local_728._M_allocated_capacity._4_4_;
  local_3c8._M_allocated_capacity._0_4_ = local_728._M_allocated_capacity._0_4_;
  local_3d0 = local_730;
  local_730 = 0;
  local_728._M_allocated_capacity._0_4_ = local_728._M_allocated_capacity._0_4_ & 0xffffff00;
  local_3b8 = local_718;
  local_3b4 = local_714;
  local_828._M_unused._M_object = &local_818;
  local_738 = &local_728;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"");
  pvVar3 = &pOVar2->validators_;
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pOVar2->validators_).
                    super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
                    super__Vector_impl_data._M_start,(value_type *)&local_418);
  if (local_828._8_8_ != 0) {
    local_5f0 = (pvVar3->super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>).
                _M_impl.super__Vector_impl_data._M_start;
    local_7e0._M_unused._M_object = &local_7d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7e0,local_828._M_unused._M_object,
               local_828._8_8_ + (long)local_828._M_unused._0_8_);
    addLoggingCLI();
  }
  local_700 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_1e8.super__Function_base._M_functor._8_8_ = 0;
  local_1e8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_1e8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_1e8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_208.super__Function_base._M_functor._8_8_ = 0;
  local_208.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_208._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_208.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_7e0,&local_700,&local_1e8,&local_208);
  local_488._M_unused._M_object = (_Manager_type *)0x0;
  local_488._8_8_ = 0;
  local_478 = (_Manager_type)0x0;
  local_470 = uStack_7c8;
  if (local_7d0 != (_Manager_type)0x0) {
    local_488._M_unused._M_object = local_7e0._M_unused._M_object;
    local_488._8_8_ = local_7e0._8_8_;
    local_478 = local_7d0;
    local_7d0 = (_Manager_type)0x0;
    uStack_7c8 = 0;
  }
  local_468._M_unused._M_object = (void *)0x0;
  local_468._8_8_ = 0;
  local_458 = (code *)0x0;
  local_450 = uStack_7a8;
  if (local_7b0 != (code *)0x0) {
    local_468._M_unused._M_object = local_7c0._M_unused._M_object;
    local_468._8_8_ = local_7c0._8_8_;
    local_458 = local_7b0;
    local_7b0 = (code *)0x0;
    uStack_7a8 = 0;
  }
  if (local_7a0 == &local_790) {
    local_438._8_4_ = local_790._8_4_;
    local_438._12_4_ = local_790._12_4_;
    local_448 = &local_438;
  }
  else {
    local_448 = local_7a0;
  }
  local_438._M_allocated_capacity._4_4_ = local_790._M_allocated_capacity._4_4_;
  local_438._M_allocated_capacity._0_4_ = local_790._M_allocated_capacity._0_4_;
  local_440 = local_798;
  local_798 = 0;
  local_790._M_allocated_capacity._0_4_ = local_790._M_allocated_capacity._0_4_ & 0xffffff00;
  local_428 = local_780;
  local_424 = local_77c;
  local_800 = local_7f0;
  local_7a0 = &local_790;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pvVar3->super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>).
                    _M_impl.super__Vector_impl_data._M_start,(value_type *)&local_488);
  if (local_7f8 != 0) {
    local_6f8[0] = local_6e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6f8,local_800,local_7f8 + (long)local_800);
    addLoggingCLI();
  }
  if (local_800 != local_7f0) {
    operator_delete(local_800,local_7f0[0] + 1);
  }
  pAVar1 = local_708;
  if (local_448 != &local_438) {
    operator_delete(local_448,local_438._M_allocated_capacity + 1);
  }
  if (local_458 != (code *)0x0) {
    (*local_458)(&local_468,&local_468,__destroy_functor);
  }
  if (local_478 != (_Manager_type)0x0) {
    (*local_478)((_Any_data *)&local_488,(_Any_data *)&local_488,__destroy_functor);
  }
  if (local_7a0 != &local_790) {
    operator_delete(local_7a0,
                    CONCAT44(local_790._M_allocated_capacity._4_4_,
                             local_790._M_allocated_capacity._0_4_) + 1);
  }
  if (local_7b0 != (code *)0x0) {
    (*local_7b0)(&local_7c0,&local_7c0,__destroy_functor);
  }
  if (local_7d0 != (_Manager_type)0x0) {
    (*local_7d0)((_Any_data *)&local_7e0,(_Any_data *)&local_7e0,__destroy_functor);
  }
  if (local_208.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.super__Function_base._M_manager)
              ((_Any_data *)&local_208,(_Any_data *)&local_208,__destroy_functor);
  }
  if (local_1e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1e8.super__Function_base._M_manager)
              ((_Any_data *)&local_1e8,(_Any_data *)&local_1e8,__destroy_functor);
  }
  if ((_Manager_type *)local_828._M_unused._0_8_ != &local_818) {
    operator_delete(local_828._M_unused._M_object,(ulong)(local_818 + 1));
  }
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8,local_3c8._M_allocated_capacity + 1);
  }
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
  }
  if (local_408 != (code *)0x0) {
    (*local_408)((_Any_data *)&local_418,(_Any_data *)&local_418,__destroy_functor);
  }
  if (local_738 != &local_728) {
    operator_delete(local_738,
                    CONCAT44(local_728._M_allocated_capacity._4_4_,
                             local_728._M_allocated_capacity._0_4_) + 1);
  }
  if (local_748 != (code *)0x0) {
    (*local_748)(&local_758,&local_758,__destroy_functor);
  }
  if (local_768 != (code *)0x0) {
    (*local_768)((_Any_data *)&local_778,(_Any_data *)&local_778,__destroy_functor);
  }
  if (local_1c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1c8.super__Function_base._M_manager)
              ((_Any_data *)&local_1c8,(_Any_data *)&local_1c8,__destroy_functor);
  }
  if (local_1a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1a8.super__Function_base._M_manager)
              ((_Any_data *)&local_1a8,(_Any_data *)&local_1a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  local_778._M_unused._M_member_pointer = 10;
  fmt.size_ = 4;
  fmt.data_ = (char *)0x11;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_778;
  ::fmt::v11::vformat_abi_cxx11_(&local_80,(v11 *)"--logbuffer{{{}}}",fmt,args);
  local_6d8._8_8_ = 0;
  pcStack_6c0 = CLI::std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:197:13)>
                ::_M_invoke;
  local_6c8 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:197:13)>
              ::_M_manager;
  local_6d8._M_unused._M_object = this;
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5e8,
             "optionally specify the size of the circular buffer for storing log messages for later retrieval "
             ,"");
  pOVar2 = CLI::App::add_flag_function
                     (pAVar1,(string *)&local_80,(function<void_(long)> *)&local_6d8,&local_5e8);
  pOVar2->expected_min_ = 0;
  pOVar2->expected_max_ = 1;
  if ((pOVar2->super_OptionBase<CLI::Option>).multi_option_policy_ != TakeLast) {
    (pOVar2->super_OptionBase<CLI::Option>).multi_option_policy_ = TakeLast;
    pOVar2->current_option_state_ = parsing;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if (local_6c8 != (code *)0x0) {
    (*local_6c8)((_Any_data *)&local_6d8,(_Any_data *)&local_6d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_58._8_8_ = 0;
  pcStack_40 = CLI::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:201:29)>
               ::_M_invoke;
  local_48 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:201:29)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  CLI::App::callback(pAVar1,(function<void_()> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void LogManager::addLoggingCLI(std::shared_ptr<helicsCLI11App>& app)
{
    auto* logging_group =
        app->add_option_group("logging", "Options related to file and message logging");
    logging_group->add_flag_function(
        "--force_logging_flush",
        [this](int64_t val) {
            if (val > 0) {
                forceLoggingFlush = true;
            }
        },
        "flush the log after every message");
    logging_group->add_option("--logfile", logFile, "the file to log the messages to");
    logging_group
        ->add_option_function<int>(
            "--loglevel",
            [this](int val) { setLogLevel(val); },
            "the level at which to log, the higher this is set the more gets logged; set to \"no_print\" for no logging")
        ->envname("HELICS_BROKER_LOG_LEVEL")

        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));

    logging_group
        ->add_option("--fileloglevel",
                     fileLogLevel,
                     "the level at which messages get sent to the file")
        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));
    logging_group
        ->add_option("--consoleloglevel",
                     consoleLogLevel,
                     "the level at which messages get sent to the file")

        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));
    logging_group
        ->add_flag_function(
            fmt::format("--logbuffer{{{}}}", LogBuffer::cDefaultBufferSize),
            [this](std::int64_t val) { mLogBuffer.resize(val); },
            "optionally specify the size of the circular buffer for storing log messages for later retrieval ")
        ->expected(0, 1)
        ->multi_option_policy(CLI::MultiOptionPolicy::TakeLast);
    logging_group->callback([this]() { updateMaxLogLevel(); });
}